

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O1

int OPENSSL_posix_to_tm(int64_t time,tm *out_tm)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  
  uVar6 = time - 0x3afff44180;
  if (uVar6 < 0xffffffb686974280) {
    iVar2 = -0x76c;
    iVar12 = -1;
    iVar14 = 0;
    iVar4 = 0;
    iVar8 = 0;
    iVar11 = 0;
  }
  else {
    uVar7 = time % 0x15180;
    if (0x37bb49 < ((long)uVar7 >> 0x3f) + time / 0x15180 + 0xafaa9U) {
      __assert_fail("-61 <= days && days <= 3652364",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/posix_time.cc"
                    ,0x7f,
                    "int utc_from_posix_time(int64_t, int *, int *, int *, int *, int *, int *)");
    }
    lVar9 = ((long)uVar7 >> 0x3f) + time / 0x15180;
    uVar15 = uVar7 + 0x15180;
    if (-1 < (long)uVar7) {
      uVar15 = uVar7;
    }
    lVar3 = lVar9 + 0x8bfbc;
    if (-0xafa6c < lVar9) {
      lVar3 = lVar9 + 0xafa6c;
    }
    lVar10 = lVar9 + (lVar3 / 0x23ab1) * -0x23ab1 + 0xafa6c;
    lVar9 = SUB168(SEXT816(lVar10) * SEXT816(-0x2ce33e6c02ce33e7),8);
    lVar5 = SUB168(SEXT816(lVar10) * SEXT816(0x1a537e05fff1a537),8) - lVar10;
    lVar13 = ((lVar5 >> 0x11) - (lVar5 >> 0x3f)) +
             lVar10 / 0x8eac + ((lVar9 >> 8) - (lVar9 >> 0x3f)) + lVar10;
    lVar9 = SUB168(SEXT816(lVar13) * SEXT816(-0x2ce33e6c02ce33e7),8);
    lVar5 = ((lVar9 >> 8) - (lVar9 >> 0x3f)) + lVar10 + lVar13 / 0x8e94 + (lVar13 / 0x16d) * -0x16d;
    lVar9 = (lVar5 * 5 + 2) / 0x99;
    iVar2 = (int)lVar9;
    iVar12 = iVar2 + 3;
    if (0x131 < lVar5) {
      iVar12 = iVar2 + -9;
    }
    auVar1 = SEXT816(lVar9 * 0x99 + 2) * SEXT816(-0x6666666666666667);
    iVar11 = (int)lVar5 + ((int)(auVar1._8_8_ >> 1) - (auVar1._12_4_ >> 0x1f)) + 1;
    iVar8 = (int)(uVar15 / 0xe10);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar15 % 0xe10;
    iVar4 = SUB164(auVar1 * ZEXT816(0x444444444444445),8);
    iVar14 = (int)(uVar15 % 0xe10) + iVar4 * -0x3c;
    iVar2 = (uint)(iVar12 < 3) + (int)(lVar3 / 0x23ab1) * 400 + (int)(lVar13 / 0x16d) + -0x76c;
    iVar12 = iVar12 + -1;
  }
  if (0xffffffb68697427f < uVar6) {
    out_tm->tm_sec = iVar14;
    out_tm->tm_min = iVar4;
    out_tm->tm_hour = iVar8;
    out_tm->tm_mday = iVar11;
    out_tm->tm_mon = iVar12;
    out_tm->tm_year = iVar2;
    out_tm->tm_wday = 0;
    out_tm->tm_yday = 0;
    *(undefined8 *)&out_tm->tm_isdst = 0;
    out_tm->tm_gmtoff = 0;
    out_tm->tm_zone = (char *)0x0;
  }
  return (uint)(0xffffffb68697427f < uVar6);
}

Assistant:

int OPENSSL_posix_to_tm(int64_t time, struct tm *out_tm) {
  struct tm tmp_tm = {};
  if (!utc_from_posix_time(time, &tmp_tm.tm_year, &tmp_tm.tm_mon,
                           &tmp_tm.tm_mday, &tmp_tm.tm_hour, &tmp_tm.tm_min,
                           &tmp_tm.tm_sec)) {
    return 0;
  }
  tmp_tm.tm_year -= 1900;
  tmp_tm.tm_mon -= 1;
  *out_tm = tmp_tm;

  return 1;
}